

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::AdapterPromiseNode<int,_kj::UnixEventPort::ChildExitPromiseAdapter>::destroy
          (AdapterPromiseNode<int,_kj::UnixEventPort::ChildExitPromiseAdapter> *this)

{
  AdapterPromiseNode<int,_kj::UnixEventPort::ChildExitPromiseAdapter> *this_local;
  
  freePromise<kj::_::AdapterPromiseNode<int,kj::UnixEventPort::ChildExitPromiseAdapter>>(this);
  return;
}

Assistant:

void destroy() override { freePromise(this); }